

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O1

void Cgt_ManDetectCandidates_rec
               (Aig_Man_t *pAig,Vec_Int_t *vUseful,Aig_Obj_t *pObj,int nLevelMax,Vec_Ptr_t *vCands)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  
  if (pObj->TravId == pAig->nTravIds) {
    return;
  }
  pObj->TravId = pAig->nTravIds;
  if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
    Cgt_ManDetectCandidates_rec
              (pAig,vUseful,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),nLevelMax,
               vCands);
    Cgt_ManDetectCandidates_rec
              (pAig,vUseful,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),nLevelMax,
               vCands);
  }
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                  ,0x143,"int Aig_ObjLevel(Aig_Obj_t *)");
  }
  if (nLevelMax < (int)(*(uint *)&pObj->field_0x1c & 0xffffff)) {
    return;
  }
  if (vUseful != (Vec_Int_t *)0x0) {
    iVar3 = pObj->Id;
    if (((long)iVar3 < 0) || (vUseful->nSize <= iVar3)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if (vUseful->pArray[iVar3] == 0) {
      return;
    }
  }
  uVar1 = vCands->nCap;
  if (vCands->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vCands->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vCands->pArray,0x80);
      }
      vCands->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_0049df13;
      if (vCands->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vCands->pArray,(ulong)uVar1 << 4);
      }
      vCands->pArray = ppvVar2;
    }
    vCands->nCap = iVar3;
  }
LAB_0049df13:
  iVar3 = vCands->nSize;
  vCands->nSize = iVar3 + 1;
  vCands->pArray[iVar3] = pObj;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes transitive fanout cone of the node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cgt_ManDetectCandidates_rec( Aig_Man_t * pAig, Vec_Int_t * vUseful, Aig_Obj_t * pObj, int nLevelMax, Vec_Ptr_t * vCands )
{
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsNode(pObj) )
    {
        Cgt_ManDetectCandidates_rec( pAig, vUseful, Aig_ObjFanin0(pObj), nLevelMax, vCands );
        Cgt_ManDetectCandidates_rec( pAig, vUseful, Aig_ObjFanin1(pObj), nLevelMax, vCands );
    }
    if ( Aig_ObjLevel(pObj) <= nLevelMax && (vUseful == NULL || Vec_IntEntry(vUseful, Aig_ObjId(pObj))) )
        Vec_PtrPush( vCands, pObj );
}